

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLoadCommandCommand.cxx
# Opt level: O2

cmCommand * __thiscall cmLoadedCommand::Clone(cmLoadedCommand *this)

{
  cmLoadedCommand *this_00;
  long lVar1;
  cmLoadedCommandInfo *pcVar2;
  cmLoadedCommandInfo *pcVar3;
  byte bVar4;
  
  bVar4 = 0;
  this_00 = (cmLoadedCommand *)operator_new(0xb0);
  cmLoadedCommand(this_00);
  pcVar2 = &this->info;
  pcVar3 = &this_00->info;
  for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
    pcVar3->reserved1 = pcVar2->reserved1;
    pcVar2 = (cmLoadedCommandInfo *)((long)pcVar2 + (ulong)bVar4 * -0x10 + 8);
    pcVar3 = (cmLoadedCommandInfo *)((long)pcVar3 + (ulong)bVar4 * -0x10 + 8);
  }
  return &this_00->super_cmCommand;
}

Assistant:

virtual cmCommand* Clone()
    {
      cmLoadedCommand *newC = new cmLoadedCommand;
      // we must copy when we clone
      memcpy(&newC->info,&this->info,sizeof(info));
      return newC;
    }